

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O1

void wasm::OptUtils::addUsefulPassesAfterInlining(PassRunner *runner)

{
  string local_70;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"precompute-propagate","");
  local_30 = false;
  PassRunner::add(runner,&local_70,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  if (local_30 == true) {
    local_30 = false;
    if (local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10)) {
      operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  PassRunner::addDefaultFunctionOptimizationPasses(runner);
  return;
}

Assistant:

inline void addUsefulPassesAfterInlining(PassRunner& runner) {
  // Propagating constants makes a lot of sense after inlining, as new constants
  // may have arrived.
  runner.add("precompute-propagate");
  // Do all the usual stuff.
  runner.addDefaultFunctionOptimizationPasses();
}